

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::HighsHashTable
          (HighsHashTable<int,_std::pair<double,_int>_> *this,u64 minCapacity)

{
  double *pdVar1;
  undefined8 in_RSI;
  unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  *in_RDI;
  double capacity;
  double __x;
  undefined1 auVar2 [16];
  u64 initCapacity;
  HighsHashTable<int,_std::pair<double,_int>_> *this_00;
  
  std::
  unique_ptr<HighsHashTableEntry<int,std::pair<double,int>>,HighsHashTable<int,std::pair<double,int>>::OpNewDeleter>
  ::unique_ptr<HighsHashTable<int,std::pair<double,int>>::OpNewDeleter,void>(in_RDI);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  in_RDI[4]._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_std::pair<double,_int>_> *)0x0;
  this_00 = (HighsHashTable<int,_std::pair<double,_int>_> *)0x4060000000000000;
  auVar2._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar2._0_8_ = in_RSI;
  auVar2._12_4_ = 0x45300000;
  capacity = (((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) * 8.0) / 7.0;
  pdVar1 = std::max<double>((double *)&stack0xffffffffffffffe0,(double *)&stack0xffffffffffffffd8);
  __x = log2(*pdVar1);
  ceil(__x);
  makeEmptyTable(this_00,(u64)capacity);
  return;
}

Assistant:

HighsHashTable(u64 minCapacity) {
    u64 initCapacity = u64{1} << (u64)std::ceil(std::log2(std::max(
                           128.0, 8 * static_cast<double>(minCapacity) / 7)));
    makeEmptyTable(initCapacity);
  }